

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderIndexingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::ShaderIndexingCase::init(ShaderIndexingCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int iVar2;
  CompileFailed *anon_var_0;
  bool isSupported;
  ShaderIndexingCase *this_local;
  
  if (((this->m_requirements & 1) == 0) &&
     ((((this->m_requirements & 2) == 0 ||
       (uVar1 = (*((this->super_ShaderRenderCase).m_ctxInfo)->_vptr_ContextInfo[5])(),
       (uVar1 & 1) != 0)) && ((this->m_requirements & 4) != 0)))) {
    (*((this->super_ShaderRenderCase).m_ctxInfo)->_vptr_ContextInfo[8])();
  }
  iVar2 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx);
  return iVar2;
}

Assistant:

void ShaderIndexingCase::init (void)
{
	const bool isSupported = !(m_requirements & REQUIREMENT_UNIFORM_INDEXING) &&
							 (!(m_requirements & REQUIREMENT_VERTEX_UNIFORM_LOOPS) || m_ctxInfo.isVertexUniformLoopSupported()) &&
							 (!(m_requirements & REQUIREMENT_FRAGMENT_UNIFORM_LOOPS) || m_ctxInfo.isFragmentUniformLoopSupported());

	try
	{
		ShaderRenderCase::init();
	}
	catch (const CompileFailed&)
	{
		if (!isSupported)
			throw tcu::NotSupportedError("Shader is not supported");
		else
			throw;
	}
}